

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-test-part.cc
# Opt level: O2

void __thiscall
testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
          (HasNewFatalFailureHelper *this)

{
  UnitTestImpl *pUVar1;
  TestPartResultReporterInterface *pTVar2;
  TestPartResultReporterInterface **ppTVar3;
  
  (this->super_TestPartResultReporterInterface)._vptr_TestPartResultReporterInterface =
       (_func_int **)&PTR__HasNewFatalFailureHelper_00176730;
  this->has_new_fatal_failure_ = false;
  pUVar1 = GetUnitTestImpl();
  pTVar2 = UnitTestImpl::GetTestPartResultReporterForCurrentThread(pUVar1);
  this->original_reporter_ = pTVar2;
  pUVar1 = GetUnitTestImpl();
  ppTVar3 = ThreadLocal<testing::TestPartResultReporterInterface_*>::GetOrCreateValue
                      (&pUVar1->per_thread_test_part_result_reporter_);
  *ppTVar3 = &this->super_TestPartResultReporterInterface;
  return;
}

Assistant:

HasNewFatalFailureHelper::HasNewFatalFailureHelper()
    : has_new_fatal_failure_(false),
      original_reporter_(GetUnitTestImpl()->
                         GetTestPartResultReporterForCurrentThread()) {
  GetUnitTestImpl()->SetTestPartResultReporterForCurrentThread(this);
}